

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O2

ssize_t __thiscall rw::TGAHeader::read(TGAHeader *this,int __fd,void *__buf,size_t __nbytes)

{
  int16 iVar1;
  Stream *this_00;
  int8 iVar2;
  uint8 uVar3;
  undefined1 extraout_AH;
  undefined6 extraout_var;
  undefined4 in_register_00000034;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  iVar2 = Stream::readI8((Stream *)CONCAT44(in_register_00000034,__fd));
  this->IDlen = iVar2;
  iVar2 = Stream::readI8(this_00);
  this->colorMapType = iVar2;
  iVar2 = Stream::readI8(this_00);
  this->imageType = iVar2;
  iVar1 = Stream::readI16(this_00);
  this->colorMapOrigin = iVar1;
  iVar1 = Stream::readI16(this_00);
  this->colorMapLength = iVar1;
  iVar2 = Stream::readI8(this_00);
  this->colorMapDepth = iVar2;
  iVar1 = Stream::readI16(this_00);
  this->xOrigin = iVar1;
  iVar1 = Stream::readI16(this_00);
  this->yOrigin = iVar1;
  iVar1 = Stream::readI16(this_00);
  this->width = iVar1;
  iVar1 = Stream::readI16(this_00);
  this->height = iVar1;
  uVar3 = Stream::readU8(this_00);
  this->depth = uVar3;
  uVar3 = Stream::readU8(this_00);
  this->descriptor = uVar3;
  return CONCAT62(extraout_var,CONCAT11(extraout_AH,uVar3));
}

Assistant:

void
TGAHeader::read(Stream *stream)
{
	IDlen = stream->readI8();
	colorMapType = stream->readI8();
	imageType = stream->readI8();
	colorMapOrigin = stream->readI16();
	colorMapLength = stream->readI16();
	colorMapDepth = stream->readI8();
	xOrigin = stream->readI16();
	yOrigin = stream->readI16();
	width = stream->readI16();
	height = stream->readI16();
	depth = stream->readU8();
	descriptor = stream->readU8();
}